

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcDimensionCurveDirectedCallout::IfcDimensionCurveDirectedCallout
          (IfcDimensionCurveDirectedCallout *this)

{
  IfcDimensionCurveDirectedCallout *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcDraughtingCallout).field_0x58,
             "IfcDimensionCurveDirectedCallout");
  IfcDraughtingCallout::IfcDraughtingCallout
            (&this->super_IfcDraughtingCallout,&PTR_construction_vtable_24__010796a8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDimensionCurveDirectedCallout,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcDimensionCurveDirectedCallout,_0UL> *)
             &(this->super_IfcDraughtingCallout).field_0x48,&PTR_construction_vtable_24__01079720);
  (this->super_IfcDraughtingCallout).super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x10795f0;
  *(undefined8 *)&(this->super_IfcDraughtingCallout).field_0x58 = 0x1079690;
  *(undefined8 *)
   &(this->super_IfcDraughtingCallout).super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x1079618;
  *(undefined8 *)
   &(this->super_IfcDraughtingCallout).super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x1079640;
  *(undefined8 *)&(this->super_IfcDraughtingCallout).field_0x48 = 0x1079668;
  return;
}

Assistant:

IfcDimensionCurveDirectedCallout() : Object("IfcDimensionCurveDirectedCallout") {}